

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAddressCode.cpp
# Opt level: O0

Factor * MyCompiler::visitFactor
                   (Factor *ast,
                   vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
                   *result,unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *usedIdents,int *tempIdentCounter)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *ast_00;
  int *in_R8;
  int *tempIdentCounter_local;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *usedIdents_local;
  vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
  *result_local;
  Factor *ast_local;
  
  iVar1 = *(int *)((long)&(result->
                          super__Vector_base<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 4);
  if (iVar1 == 0) {
    peVar2 = std::__shared_ptr_access<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(result + 3));
    std::__cxx11::string::string((string *)ast,(string *)&(peVar2->super_AbstractAstNode).value);
  }
  else if (iVar1 == 1) {
    peVar3 = std::__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MyCompiler::Number,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&result[3].
                              super__Vector_base<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::string((string *)ast,(string *)&(peVar3->super_AbstractAstNode).value);
  }
  else {
    ast_00 = std::
             __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&result[4].
                           super__Vector_base<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
    visitExpression((MyCompiler *)ast,ast_00,
                    (vector<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>,_std::allocator<std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4UL>_>_>
                     *)usedIdents,
                    (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)tempIdentCounter,in_R8);
  }
  return ast;
}

Assistant:

std::string MyCompiler::visitFactor(MyCompiler::Factor &ast,
                                    std::vector<std::array<std::string, 4>> &result,
                                    std::unordered_set<std::string> &usedIdents,
                                    int &tempIdentCounter)
{
    switch (ast.caseNum)
    {
        case 0:
            return ast.pIdent->value;
        case 1:
            return ast.pNumber->value;
        default:
            return visitExpression(*ast.pExpression, result, usedIdents, tempIdentCounter);
    }
}